

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

SerializedMessage *
miniros::serialization::serializeMessage<std_msgs::String_<std::allocator<void>>>
          (String_<std::allocator<void>_> *message)

{
  uchar *__p;
  uint8_t *puVar1;
  SerializedMessage *in_RDI;
  OStream s;
  uint32_t len;
  SerializedMessage *m;
  uint *in_stack_ffffffffffffff98;
  Stream *this;
  SerializedMessage *in_stack_ffffffffffffffa0;
  SerializedMessage *this_00;
  SerializedMessage *this_01;
  Stream local_38 [2];
  uint32_t local_18;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  SerializedMessage::SerializedMessage(in_stack_ffffffffffffffa0);
  local_18 = serializationLength<std_msgs::String_<std::allocator<void>>>
                       ((String_<std::allocator<void>_> *)0x1ec12f);
  this_00->num_bytes = (ulong)(local_18 + 4);
  this_01 = this_00;
  __p = (uchar *)operator_new__(this_00->num_bytes);
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this_01,__p);
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this_01);
  OStream::OStream((OStream *)this_00,(uint8_t *)in_stack_ffffffffffffff98,0);
  serialize<unsigned_int,miniros::serialization::OStream>
            ((OStream *)this_00,in_stack_ffffffffffffff98);
  this = local_38;
  puVar1 = Stream::getData(this);
  this_01->message_start = puVar1;
  serialize<std_msgs::String_<std::allocator<void>>,miniros::serialization::OStream>
            ((OStream *)this_00,(String_<std::allocator<void>_> *)this);
  return in_RDI;
}

Assistant:

inline SerializedMessage serializeMessage(const M& message)
{
  SerializedMessage m;
  uint32_t len = serializationLength(message);
  m.num_bytes = len + 4;
  m.buf.reset(new uint8_t[m.num_bytes]);

  OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
  serialize(s, static_cast<uint32_t>(m.num_bytes) - 4);
  m.message_start = s.getData();
  serialize(s, message);

  return m;
}